

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

MidiEvent * __thiscall
smf::MidiFile::addNoteOff(MidiFile *this,int aTrack,int aTick,int aChannel,int key,int vel)

{
  MidiEvent *this_00;
  
  this_00 = (MidiEvent *)operator_new(0x38);
  MidiEvent::MidiEvent(this_00);
  MidiMessage::makeNoteOff((MidiMessage *)this_00,aChannel,key,vel);
  this_00->tick = aTick;
  MidiEventList::push_back_no_copy
            ((this->m_events).
             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl
             .super__Vector_impl_data._M_start[aTrack],this_00);
  return this_00;
}

Assistant:

MidiEvent* MidiFile::addNoteOff(int aTrack, int aTick, int aChannel, int key,
		int vel) {
	MidiEvent* me = new MidiEvent;
	me->makeNoteOff(aChannel, key, vel);
	me->tick = aTick;
	m_events[aTrack]->push_back_no_copy(me);
	return me;
}